

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::CommandLine(CommandLine<Catch::ConfigData> *this)

{
  IArgFunction<Catch::ConfigData> *_functionObj;
  CommandLine<Catch::ConfigData> *this_local;
  
  _functionObj = (IArgFunction<Catch::ConfigData> *)operator_new(8);
  memset(_functionObj,0,8);
  Detail::NullBinder<Catch::ConfigData>::NullBinder((NullBinder<Catch::ConfigData> *)_functionObj);
  Detail::BoundArgFunction<Catch::ConfigData>::BoundArgFunction
            (&this->m_boundProcessName,_functionObj);
  std::
  vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
  ::vector(&this->m_options);
  std::
  map<int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::less<int>,_std::allocator<std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
  ::map(&this->m_positionalArgs);
  std::
  unique_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>>
  ::unique_ptr<std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>,void>
            ((unique_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>>
              *)&this->m_floatingArg);
  this->m_highestSpecifiedArgPosition = 0;
  this->m_throwOnUnrecognisedTokens = false;
  return;
}

Assistant:

CommandLine()
        :   m_boundProcessName( new Detail::NullBinder<ConfigT>() ),
            m_highestSpecifiedArgPosition( 0 ),
            m_throwOnUnrecognisedTokens( false )
        {}